

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadBlif.c
# Opt level: O1

Vec_Ptr_t * Psr_ManReadBlif(char *pFileName)

{
  Vec_Int_t *p;
  undefined1 *puVar1;
  char *pcVar2;
  char cVar3;
  uint uVar4;
  int *piVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  FILE *__stream;
  long lVar9;
  char *pcVar10;
  Psr_Man_t *p_00;
  Abc_Nam_t *pAVar11;
  Vec_Ptr_t *pVVar12;
  void **ppvVar13;
  byte *pbVar14;
  ulong uVar15;
  Psr_Ntk_t *pPVar16;
  uint uVar17;
  byte *pbVar18;
  size_t sVar19;
  char *unaff_R12;
  long lVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    puts("Cannot open input file.");
    pcVar10 = (char *)0x0;
  }
  else {
    fseek(__stream,0,2);
    lVar9 = ftell(__stream);
    rewind(__stream);
    lVar20 = lVar9 << 0x20;
    pcVar10 = (char *)malloc(lVar20 + 0x1000000000 >> 0x20);
    *pcVar10 = '\n';
    fread(pcVar10 + 1,(long)(int)lVar9,1,__stream);
    fclose(__stream);
    pcVar10[lVar20 + 0x100000000 >> 0x20] = '\n';
    pcVar10[lVar20 + 0x200000000 >> 0x20] = '\0';
    unaff_R12 = pcVar10 + (long)(int)lVar9 + 3;
  }
  if (pcVar10 == (char *)0x0) {
    p_00 = (Psr_Man_t *)0x0;
  }
  else {
    p_00 = (Psr_Man_t *)calloc(1,0x488);
    p_00->pName = pFileName;
    p_00->pBuffer = pcVar10;
    p_00->pLimit = unaff_R12;
    p_00->pCur = pcVar10;
    pAVar11 = Abc_NamStart(1000,0x18);
    p_00->pStrs = pAVar11;
    pVVar12 = (Vec_Ptr_t *)malloc(0x10);
    pVVar12->nCap = 100;
    pVVar12->nSize = 0;
    ppvVar13 = (void **)malloc(800);
    pVVar12->pArray = ppvVar13;
    p_00->vNtks = pVVar12;
  }
  if (p_00 == (Psr_Man_t *)0x0) {
    return (Vec_Ptr_t *)0x0;
  }
  lVar9 = 1;
  do {
    Abc_NamStrFindOrAdd(p_00->pStrs,s_BlifTypes[lVar9],(int *)0x0);
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0xb);
  iVar7 = Abc_NamObjNumMax(p_00->pStrs);
  if (iVar7 != 0xb) {
    __assert_fail("Abc_NamObjNumMax(p->pStrs) == i",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacReadBlif.c"
                  ,0x42,"void Psr_NtkAddBlifDirectives(Psr_Man_t *)");
  }
  pcVar10 = p_00->pCur;
  if (pcVar10[1] != '\0') {
    pcVar2 = p_00->ErrorStr;
    p = &p_00->vTemp;
    do {
      pbVar14 = (byte *)(pcVar10 + 1);
      if (*pcVar10 != '\n') {
        __assert_fail("Psr_ManIsChar(p, \'\\n\')",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacReadBlif.c"
                      ,0x180,"int Psr_ManReadLines(Psr_Man_t *)");
      }
LAB_00395663:
      p_00->pCur = (char *)pbVar14;
      bVar6 = *pbVar14;
      if (bVar6 < 0x20) {
        if ((bVar6 != 9) && (bVar6 != 0xd)) goto LAB_003956b5;
LAB_0039569b:
        pbVar14 = pbVar14 + 1;
        goto LAB_00395663;
      }
      if (bVar6 == 0x20) goto LAB_0039569b;
      if (bVar6 == 0x5c) {
        pbVar18 = pbVar14 + 1;
        do {
          p_00->pCur = (char *)pbVar18;
          pbVar14 = pbVar18 + 1;
          bVar6 = *pbVar18;
          pbVar18 = pbVar14;
        } while (bVar6 != 10);
        goto LAB_00395663;
      }
      if (bVar6 == 0x23) {
        do {
          pbVar14 = pbVar14 + 1;
          p_00->pCur = (char *)pbVar14;
        } while (*pbVar14 != 10);
      }
LAB_003956b5:
      bVar6 = *p_00->pCur;
      uVar15 = (ulong)bVar6;
      if (0x31 < uVar15) {
LAB_00396472:
        if (bVar6 != 10) {
          if (bVar6 != 9) {
            __assert_fail("Psr_ManIsLit(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacReadBlif.c"
                          ,0xc9,"int Psr_ManReadCube(Psr_Man_t *)");
          }
          goto LAB_0039663d;
        }
        goto LAB_0039647b;
      }
      if ((0x3200000000000U >> (uVar15 & 0x3f) & 1) != 0) {
        while( true ) {
          pbVar14 = (byte *)p_00->pCur;
          if ((0x31 < (ulong)*pbVar14) || ((0x3200000000000U >> ((ulong)*pbVar14 & 0x3f) & 1) == 0))
          break;
          p_00->pCur = (char *)(pbVar14 + 1);
          bVar6 = *pbVar14;
          uVar17 = (p_00->vCover).nCap;
          if ((p_00->vCover).nSize == uVar17) {
            if ((int)uVar17 < 0x10) {
              pcVar10 = (p_00->vCover).pArray;
              if (pcVar10 == (char *)0x0) {
                pcVar10 = (char *)malloc(0x10);
              }
              else {
                pcVar10 = (char *)realloc(pcVar10,0x10);
              }
              sVar19 = 0x10;
            }
            else {
              sVar19 = (ulong)uVar17 * 2;
              if ((int)sVar19 <= (int)uVar17) goto LAB_0039574a;
              pcVar10 = (p_00->vCover).pArray;
              if (pcVar10 == (char *)0x0) {
                pcVar10 = (char *)malloc(sVar19);
              }
              else {
                pcVar10 = (char *)realloc(pcVar10,sVar19);
              }
            }
            (p_00->vCover).pArray = pcVar10;
            (p_00->vCover).nCap = (int)sVar19;
          }
LAB_0039574a:
          iVar7 = (p_00->vCover).nSize;
          (p_00->vCover).nSize = iVar7 + 1;
          (p_00->vCover).pArray[iVar7] = bVar6;
        }
LAB_00395772:
        bVar6 = *pbVar14;
        if (bVar6 < 0x20) {
          if ((bVar6 != 9) && (bVar6 != 0xd)) goto LAB_003957bd;
LAB_0039576b:
          pbVar14 = pbVar14 + 1;
LAB_0039576e:
          p_00->pCur = (char *)pbVar14;
          goto LAB_00395772;
        }
        if (bVar6 == 0x20) goto LAB_0039576b;
        if (bVar6 == 0x5c) {
          pbVar18 = pbVar14 + 1;
          do {
            p_00->pCur = (char *)pbVar18;
            pbVar14 = pbVar18 + 1;
            bVar6 = *pbVar18;
            pbVar18 = pbVar14;
          } while (bVar6 != 10);
          goto LAB_0039576e;
        }
        if (bVar6 == 0x23) {
          do {
            pbVar14 = pbVar14 + 1;
            p_00->pCur = (char *)pbVar14;
          } while (*pbVar14 != 10);
        }
LAB_003957bd:
        uVar15 = (ulong)(byte)*p_00->pCur;
        if (uVar15 < 0x32) {
          if ((0x3200000000000U >> (uVar15 & 0x3f) & 1) == 0) {
            if (uVar15 != 10) {
              if ((0x100002200U >> (uVar15 & 0x3f) & 1) != 0) goto LAB_0039663d;
              goto LAB_003958ff;
            }
            if ((p_00->vCover).nSize == 1) {
              pcVar10 = (p_00->vCover).pArray;
              cVar3 = *pcVar10;
              if ((p_00->vCover).nCap == 1) {
                pcVar10 = (char *)realloc(pcVar10,0x10);
                (p_00->vCover).pArray = pcVar10;
                (p_00->vCover).nCap = 0x10;
              }
              iVar7 = (p_00->vCover).nSize;
              (p_00->vCover).nSize = iVar7 + 1;
              (p_00->vCover).pArray[iVar7] = cVar3;
              if ((p_00->vCover).nSize < 1) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                              ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
              }
              *(p_00->vCover).pArray = ' ';
              uVar17 = (p_00->vCover).nCap;
              if ((p_00->vCover).nSize == uVar17) {
                if ((int)uVar17 < 0x10) {
                  pcVar10 = (p_00->vCover).pArray;
                  if (pcVar10 == (char *)0x0) {
                    pcVar10 = (char *)malloc(0x10);
                  }
                  else {
                    pcVar10 = (char *)realloc(pcVar10,0x10);
                  }
                  sVar19 = 0x10;
                }
                else {
                  sVar19 = (ulong)uVar17 * 2;
                  if ((int)sVar19 <= (int)uVar17) goto LAB_00395dcd;
                  pcVar10 = (p_00->vCover).pArray;
                  if (pcVar10 == (char *)0x0) {
                    pcVar10 = (char *)malloc(sVar19);
                  }
                  else {
                    pcVar10 = (char *)realloc(pcVar10,sVar19);
                  }
                }
                (p_00->vCover).pArray = pcVar10;
                (p_00->vCover).nCap = (int)sVar19;
              }
LAB_00395dcd:
              iVar7 = (p_00->vCover).nSize;
              (p_00->vCover).nSize = iVar7 + 1;
              (p_00->vCover).pArray[iVar7] = '\n';
              goto LAB_00395ddf;
            }
            if (*pcVar2 != '\0') goto LAB_00396619;
            builtin_strncpy(pcVar2,"Cannot read cube.",0x12);
            goto LAB_00395afd;
          }
          uVar17 = (p_00->vCover).nCap;
          if ((p_00->vCover).nSize == uVar17) {
            if ((int)uVar17 < 0x10) {
              pcVar10 = (p_00->vCover).pArray;
              if (pcVar10 == (char *)0x0) {
                pcVar10 = (char *)malloc(0x10);
              }
              else {
                pcVar10 = (char *)realloc(pcVar10,0x10);
              }
              sVar19 = 0x10;
            }
            else {
              sVar19 = (ulong)uVar17 * 2;
              if ((int)sVar19 <= (int)uVar17) goto LAB_0039595d;
              pcVar10 = (p_00->vCover).pArray;
              if (pcVar10 == (char *)0x0) {
                pcVar10 = (char *)malloc(sVar19);
              }
              else {
                pcVar10 = (char *)realloc(pcVar10,sVar19);
              }
            }
            (p_00->vCover).pArray = pcVar10;
            (p_00->vCover).nCap = (int)sVar19;
          }
LAB_0039595d:
          iVar7 = (p_00->vCover).nSize;
          (p_00->vCover).nSize = iVar7 + 1;
          (p_00->vCover).pArray[iVar7] = ' ';
          pcVar10 = p_00->pCur;
          p_00->pCur = pcVar10 + 1;
          cVar3 = *pcVar10;
          uVar17 = (p_00->vCover).nCap;
          if ((p_00->vCover).nSize == uVar17) {
            if ((int)uVar17 < 0x10) {
              pcVar10 = (p_00->vCover).pArray;
              if (pcVar10 == (char *)0x0) {
                pcVar10 = (char *)malloc(0x10);
              }
              else {
                pcVar10 = (char *)realloc(pcVar10,0x10);
              }
              sVar19 = 0x10;
            }
            else {
              sVar19 = (ulong)uVar17 * 2;
              if ((int)sVar19 <= (int)uVar17) goto LAB_003959d6;
              pcVar10 = (p_00->vCover).pArray;
              if (pcVar10 == (char *)0x0) {
                pcVar10 = (char *)malloc(sVar19);
              }
              else {
                pcVar10 = (char *)realloc(pcVar10,sVar19);
              }
            }
            (p_00->vCover).pArray = pcVar10;
            (p_00->vCover).nCap = (int)sVar19;
          }
LAB_003959d6:
          iVar7 = (p_00->vCover).nSize;
          (p_00->vCover).nSize = iVar7 + 1;
          (p_00->vCover).pArray[iVar7] = cVar3;
          uVar17 = (p_00->vCover).nCap;
          if ((p_00->vCover).nSize == uVar17) {
            if ((int)uVar17 < 0x10) {
              pcVar10 = (p_00->vCover).pArray;
              if (pcVar10 == (char *)0x0) {
                pcVar10 = (char *)malloc(0x10);
              }
              else {
                pcVar10 = (char *)realloc(pcVar10,0x10);
              }
              sVar19 = 0x10;
            }
            else {
              sVar19 = (ulong)uVar17 * 2;
              if ((int)sVar19 <= (int)uVar17) goto LAB_00395a40;
              pcVar10 = (p_00->vCover).pArray;
              if (pcVar10 == (char *)0x0) {
                pcVar10 = (char *)malloc(sVar19);
              }
              else {
                pcVar10 = (char *)realloc(pcVar10,sVar19);
              }
            }
            (p_00->vCover).pArray = pcVar10;
            (p_00->vCover).nCap = (int)sVar19;
          }
LAB_00395a40:
          iVar7 = (p_00->vCover).nSize;
          (p_00->vCover).nSize = iVar7 + 1;
          (p_00->vCover).pArray[iVar7] = '\n';
          pbVar14 = (byte *)p_00->pCur;
LAB_00395a56:
          bVar6 = *pbVar14;
          if (bVar6 < 0x20) {
            if ((bVar6 != 9) && (bVar6 != 0xd)) goto LAB_00395aa8;
LAB_00395a8a:
            pbVar14 = pbVar14 + 1;
LAB_00395a8d:
            p_00->pCur = (char *)pbVar14;
            goto LAB_00395a56;
          }
          if (bVar6 == 0x20) goto LAB_00395a8a;
          if (bVar6 == 0x5c) {
            pbVar18 = pbVar14 + 1;
            do {
              p_00->pCur = (char *)pbVar18;
              pbVar14 = pbVar18 + 1;
              bVar6 = *pbVar18;
              pbVar18 = pbVar14;
            } while (bVar6 != 10);
            goto LAB_00395a8d;
          }
          if (bVar6 == 0x23) {
            do {
              pbVar14 = pbVar14 + 1;
              p_00->pCur = (char *)pbVar14;
            } while (*pbVar14 != 10);
          }
LAB_00395aa8:
          bVar6 = *p_00->pCur;
          if (bVar6 < 0xd) {
            if (bVar6 == 10) goto LAB_00395ddf;
            if (bVar6 == 9) goto LAB_0039663d;
          }
          else if ((bVar6 == 0x20) || (bVar6 == 0xd)) goto LAB_0039663d;
          if (*pcVar2 != '\0') goto LAB_00396619;
          builtin_strncpy(p_00->ErrorStr + 9,"ad end of cube.",0x10);
          uVar21._0_1_ = 'C';
          uVar21._1_1_ = 'a';
          uVar21._2_1_ = 'n';
          uVar21._3_1_ = 'n';
          uVar22._0_1_ = 'o';
          uVar22._1_1_ = 't';
          uVar22._2_1_ = ' ';
          uVar22._3_1_ = 'r';
          uVar23._0_1_ = 'e';
          uVar23._1_1_ = 'a';
          uVar23._2_1_ = 'd';
          uVar23._3_1_ = ' ';
          uVar24._0_1_ = 'e';
          uVar24._1_1_ = 'n';
          uVar24._2_1_ = 'd';
          uVar24._3_1_ = ' ';
        }
        else {
LAB_003958ff:
          if (*pcVar2 != '\0') goto LAB_00396619;
          builtin_strncpy(p_00->ErrorStr + 0xc,"output literal.",0x10);
          uVar21._0_1_ = 'C';
          uVar21._1_1_ = 'a';
          uVar21._2_1_ = 'n';
          uVar21._3_1_ = 'n';
          uVar22._0_1_ = 'o';
          uVar22._1_1_ = 't';
          uVar22._2_1_ = ' ';
          uVar22._3_1_ = 'r';
          uVar23._0_1_ = 'e';
          uVar23._1_1_ = 'a';
          uVar23._2_1_ = 'd';
          uVar23._3_1_ = ' ';
          uVar24._0_1_ = 'o';
          uVar24._1_1_ = 'u';
          uVar24._2_1_ = 't';
          uVar24._3_1_ = 'p';
        }
        goto LAB_00395af8;
      }
      if (uVar15 != 0x2e) {
        if ((0x100002000U >> (uVar15 & 0x3f) & 1) != 0) goto LAB_0039663d;
        goto LAB_00396472;
      }
      iVar7 = (p_00->vCover).nSize;
      if (0 < (long)iVar7) {
        bVar6 = 4;
        if (iVar7 == 0) {
LAB_00395844:
          puVar1 = &p_00->pNtk->field_0x4;
          *puVar1 = *puVar1 | bVar6;
        }
        else if (iVar7 == 2) {
          cVar3 = (p_00->vCover).pArray[(long)iVar7 + -1];
          if (cVar3 != '0') {
            if (cVar3 != '1') {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacReadBlif.c"
                            ,0xe9,"void Psr_ManSaveCover(Psr_Man_t *)");
            }
            bVar6 = 8;
          }
          goto LAB_00395844;
        }
        uVar17 = (p_00->vCover).nSize;
        if ((int)uVar17 < 1) {
          __assert_fail("Vec_StrSize(&p->vCover) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacReadBlif.c"
                        ,0xeb,"void Psr_ManSaveCover(Psr_Man_t *)");
        }
        uVar4 = (p_00->vCover).nCap;
        if (uVar17 == uVar4) {
          if ((int)uVar4 < 0x10) {
            pcVar10 = (p_00->vCover).pArray;
            if (pcVar10 == (char *)0x0) {
              pcVar10 = (char *)malloc(0x10);
            }
            else {
              pcVar10 = (char *)realloc(pcVar10,0x10);
            }
            sVar19 = 0x10;
          }
          else {
            sVar19 = (ulong)uVar4 * 2;
            if ((int)sVar19 <= (int)uVar4) goto LAB_00395bfa;
            pcVar10 = (p_00->vCover).pArray;
            if (pcVar10 == (char *)0x0) {
              pcVar10 = (char *)malloc(sVar19);
            }
            else {
              pcVar10 = (char *)realloc(pcVar10,sVar19);
            }
          }
          (p_00->vCover).pArray = pcVar10;
          (p_00->vCover).nCap = (int)sVar19;
        }
LAB_00395bfa:
        iVar7 = (p_00->vCover).nSize;
        (p_00->vCover).nSize = iVar7 + 1;
        (p_00->vCover).pArray[iVar7] = '\0';
        pcVar10 = (p_00->vCover).pArray;
        iVar7 = strcmp(pcVar10," 0\n");
        if (iVar7 == 0) {
          iVar7 = 6;
        }
        else {
          iVar7 = strcmp(pcVar10," 1\n");
          if (iVar7 == 0) {
            iVar7 = 7;
          }
          else {
            iVar7 = strcmp(pcVar10,"1 1\n");
            if (iVar7 == 0) {
              iVar7 = 10;
            }
            else {
              iVar7 = strcmp(pcVar10,"0 1\n");
              if (iVar7 == 0) {
                iVar7 = 0xb;
              }
              else {
                iVar7 = strcmp(pcVar10,"11 1\n");
                if (iVar7 == 0) {
                  iVar7 = 0xc;
                }
                else {
                  iVar7 = strcmp(pcVar10,"00 1\n");
                  if (iVar7 == 0) {
                    iVar7 = 0xf;
                  }
                  else {
                    iVar8 = strcmp(pcVar10,"00 0\n");
                    iVar7 = 0xe;
                    if (((iVar8 != 0) && (iVar8 = strcmp(pcVar10,"-1 1\n1- 1\n"), iVar8 != 0)) &&
                       (iVar8 = strcmp(pcVar10,"1- 1\n-1 1\n"), iVar8 != 0)) {
                      iVar8 = strcmp(pcVar10,"01 1\n10 1\n");
                      iVar7 = 0x10;
                      if ((iVar8 != 0) && (iVar8 = strcmp(pcVar10,"10 1\n01 1\n"), iVar8 != 0)) {
                        iVar8 = strcmp(pcVar10,"11 1\n00 1\n");
                        iVar7 = 0x11;
                        if ((iVar8 != 0) && (iVar8 = strcmp(pcVar10,"00 1\n11 1\n"), iVar8 != 0)) {
                          iVar7 = strcmp(pcVar10,"10 1\n");
                          if (iVar7 == 0) {
                            iVar7 = 0x12;
                          }
                          else {
                            iVar8 = strcmp(pcVar10,"01 1\n");
                            iVar7 = 0x13;
                            if (iVar8 != 0) {
                              __assert_fail("0",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                                            ,0x382,"Bac_ObjType_t Ptr_SopToType(char *)");
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        (p_00->vCover).nSize = 0;
        pPVar16 = p_00->pNtk;
        lVar9 = (long)(pPVar16->vObjs).nSize;
        if (((lVar9 < 1) || (iVar8 = (pPVar16->vObjs).pArray[lVar9 + -1], iVar8 < -1)) ||
           (uVar17 = iVar8 + 1, (pPVar16->vBoxes).nSize <= (int)uVar17)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar5 = (pPVar16->vBoxes).pArray;
        if (piVar5[uVar17] != 1) {
          __assert_fail("Psr_BoxNtk(p->pNtk, Psr_NtkBoxNum(p->pNtk)-1) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacReadBlif.c"
                        ,0xf1,"void Psr_ManSaveCover(Psr_Man_t *)");
        }
        piVar5[uVar17] = iVar7;
      }
      iVar7 = Psr_ManReadName(p_00);
      switch(iVar7) {
      case 1:
        if (p_00->pNtk == (Psr_Ntk_t *)0x0) {
          iVar7 = Psr_ManReadName(p_00);
          if (iVar7 == 0) {
            if (*pcVar2 != '\0') goto LAB_00396619;
            builtin_strncpy(pcVar2,"Cannot read model name.",0x18);
          }
          else {
            if (p_00->pNtk != (Psr_Ntk_t *)0x0) {
              __assert_fail("p->pNtk == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPrs.h"
                            ,0xb4,"void Psr_ManInitializeNtk(Psr_Man_t *, int, int)");
            }
            pPVar16 = (Psr_Ntk_t *)calloc(1,0xe0);
            p_00->pNtk = pPVar16;
            pPVar16->iModuleName = iVar7;
            pPVar16->field_0x4 = pPVar16->field_0x4 & 0xfd;
            pAVar11 = Abc_NamRef(p_00->pStrs);
            pPVar16 = p_00->pNtk;
            pPVar16->pStrs = pAVar11;
            pVVar12 = p_00->vNtks;
            uVar17 = pVVar12->nCap;
            if (pVVar12->nSize == uVar17) {
              if ((int)uVar17 < 0x10) {
                if (pVVar12->pArray == (void **)0x0) {
                  ppvVar13 = (void **)malloc(0x80);
                }
                else {
                  ppvVar13 = (void **)realloc(pVVar12->pArray,0x80);
                }
                pVVar12->pArray = ppvVar13;
                iVar7 = 0x10;
              }
              else {
                iVar7 = uVar17 * 2;
                if (iVar7 <= (int)uVar17) goto LAB_0039638b;
                if (pVVar12->pArray == (void **)0x0) {
                  ppvVar13 = (void **)malloc((ulong)uVar17 << 4);
                }
                else {
                  ppvVar13 = (void **)realloc(pVVar12->pArray,(ulong)uVar17 << 4);
                }
                pVVar12->pArray = ppvVar13;
              }
              pVVar12->nCap = iVar7;
            }
LAB_0039638b:
            iVar7 = pVVar12->nSize;
            pVVar12->nSize = iVar7 + 1;
            pVVar12->pArray[iVar7] = pPVar16;
            pbVar14 = (byte *)p_00->pCur;
LAB_003963a1:
            bVar6 = *pbVar14;
            if (bVar6 < 0x20) {
              if ((bVar6 != 9) && (bVar6 != 0xd)) goto LAB_003963f3;
LAB_003963d5:
              pbVar14 = pbVar14 + 1;
LAB_003963d8:
              p_00->pCur = (char *)pbVar14;
              goto LAB_003963a1;
            }
            if (bVar6 == 0x20) goto LAB_003963d5;
            if (bVar6 == 0x5c) {
              pbVar18 = pbVar14 + 1;
              do {
                p_00->pCur = (char *)pbVar18;
                pbVar14 = pbVar18 + 1;
                bVar6 = *pbVar18;
                pbVar18 = pbVar14;
              } while (bVar6 != 10);
              goto LAB_003963d8;
            }
            if (bVar6 == 0x23) {
              do {
                pbVar14 = pbVar14 + 1;
                p_00->pCur = (char *)pbVar14;
              } while (*pbVar14 != 10);
            }
LAB_003963f3:
            bVar6 = *p_00->pCur;
            if (bVar6 < 0xd) {
              if (bVar6 == 10) goto LAB_00395ddf;
              if (bVar6 == 9) goto LAB_0039663d;
            }
            else if ((bVar6 == 0x20) || (bVar6 == 0xd)) {
LAB_0039663d:
              __assert_fail("!Psr_ManIsSpace(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacReadBlif.c"
                            ,0x84,"void Psr_ManSkipSpaces(Psr_Man_t *)");
            }
            if (*pcVar2 != '\0') goto LAB_00396619;
            builtin_strncpy(pcVar2,"Trailing symbols on .model line.",0x21);
          }
        }
        else {
          if (*pcVar2 != '\0') goto LAB_00396619;
          builtin_strncpy(pcVar2,"Parsing previous model is unfinished.",0x26);
        }
        goto LAB_00395afd;
      case 2:
        pPVar16 = p_00->pNtk;
        (p_00->vTemp).nSize = 0;
        iVar7 = Psr_ManReadName(p_00);
        if (iVar7 != 0) {
          do {
            Vec_IntPush(p,iVar7);
            Vec_IntPush(&pPVar16->vOrder,iVar7 * 4 + 3);
            iVar7 = Psr_ManReadName(p_00);
          } while (iVar7 != 0);
        }
        iVar8 = (p_00->vTemp).nSize;
        if (iVar8 == 0) {
LAB_00396148:
          if (*pcVar2 != '\0') {
LAB_00396619:
            __assert_fail("!p->ErrorStr[0]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPrs.h"
                          ,0x9d,"int Psr_ManErrorSet(Psr_Man_t *, char *, int)");
          }
          builtin_strncpy(pcVar2,"Signal list is empty.",0x16);
          goto LAB_00395afd;
        }
        iVar7 = 0;
        if (0 < iVar8) {
          pPVar16 = p_00->pNtk;
          lVar9 = 0;
          do {
            Vec_IntPush(&pPVar16->vInouts,(p_00->vTemp).pArray[lVar9]);
            lVar9 = lVar9 + 1;
          } while (lVar9 < (p_00->vTemp).nSize);
LAB_0039613f:
          iVar7 = 0;
        }
        break;
      case 3:
        pPVar16 = p_00->pNtk;
        (p_00->vTemp).nSize = 0;
        iVar7 = Psr_ManReadName(p_00);
        if (iVar7 != 0) {
          do {
            Vec_IntPush(p,iVar7);
            Vec_IntPush(&pPVar16->vOrder,iVar7 * 4 + 1);
            iVar7 = Psr_ManReadName(p_00);
          } while (iVar7 != 0);
        }
        iVar8 = (p_00->vTemp).nSize;
        if (iVar8 == 0) goto LAB_00396148;
        iVar7 = 0;
        if (0 < iVar8) {
          pPVar16 = p_00->pNtk;
          lVar9 = 0;
          do {
            Vec_IntPush(&pPVar16->vInputs,(p_00->vTemp).pArray[lVar9]);
            lVar9 = lVar9 + 1;
          } while (lVar9 < (p_00->vTemp).nSize);
          goto LAB_0039613f;
        }
        break;
      case 4:
        pPVar16 = p_00->pNtk;
        (p_00->vTemp).nSize = 0;
        iVar7 = Psr_ManReadName(p_00);
        if (iVar7 != 0) {
          do {
            Vec_IntPush(p,iVar7);
            Vec_IntPush(&pPVar16->vOrder,iVar7 * 4 + 2);
            iVar7 = Psr_ManReadName(p_00);
          } while (iVar7 != 0);
        }
        iVar8 = (p_00->vTemp).nSize;
        if (iVar8 == 0) goto LAB_00396148;
        iVar7 = 0;
        if (0 < iVar8) {
          pPVar16 = p_00->pNtk;
          lVar9 = 0;
          do {
            Vec_IntPush(&pPVar16->vOutputs,(p_00->vTemp).pArray[lVar9]);
            lVar9 = lVar9 + 1;
          } while (lVar9 < (p_00->vTemp).nSize);
          goto LAB_0039613f;
        }
        break;
      case 5:
        (p_00->vTemp).nSize = 0;
        iVar7 = Psr_ManReadName(p_00);
        while (iVar7 != 0) {
          Vec_IntPush(p,0);
          Vec_IntPush(p,iVar7);
          iVar7 = Psr_ManReadName(p_00);
        }
        if ((p_00->vTemp).nSize == 0) goto LAB_00396148;
        iVar7 = 0;
        Psr_NtkAddBox(p_00->pNtk,1,0,p);
        break;
      case 6:
        iVar7 = 0;
        goto LAB_00396182;
      case 7:
        iVar7 = 1;
LAB_00396182:
        iVar7 = Psr_ManReadBox(p_00,iVar7);
        break;
      case 8:
        iVar7 = Psr_ManReadName(p_00);
        (p_00->vTemp).nSize = 0;
        if (iVar7 != 0) {
LAB_00396716:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        if (*pcVar2 != '\0') goto LAB_00396619;
        builtin_strncpy(p_00->ErrorStr + 9,"ad latch input.",0x10);
        uVar21._0_1_ = 'C';
        uVar21._1_1_ = 'a';
        uVar21._2_1_ = 'n';
        uVar21._3_1_ = 'n';
        uVar22._0_1_ = 'o';
        uVar22._1_1_ = 't';
        uVar22._2_1_ = ' ';
        uVar22._3_1_ = 'r';
        uVar23._0_1_ = 'e';
        uVar23._1_1_ = 'a';
        uVar23._2_1_ = 'd';
        uVar23._3_1_ = ' ';
        uVar24._0_1_ = 'l';
        uVar24._1_1_ = 'a';
        uVar24._2_1_ = 't';
        uVar24._3_1_ = 'c';
        goto LAB_00395af8;
      case 9:
        iVar7 = Psr_ManReadName(p_00);
        (p_00->vTemp).nSize = 0;
        if (iVar7 != 0) goto LAB_00396716;
        if (*pcVar2 != '\0') goto LAB_00396619;
        builtin_strncpy(p_00->ErrorStr + 10,"d .short input.",0x10);
        uVar21._0_1_ = 'C';
        uVar21._1_1_ = 'a';
        uVar21._2_1_ = 'n';
        uVar21._3_1_ = 'n';
        uVar22._0_1_ = 'o';
        uVar22._1_1_ = 't';
        uVar22._2_1_ = ' ';
        uVar22._3_1_ = 'r';
        uVar23._0_1_ = 'e';
        uVar23._1_1_ = 'a';
        uVar23._2_1_ = 'd';
        uVar23._3_1_ = ' ';
        uVar24._0_1_ = '.';
        uVar24._1_1_ = 's';
        uVar24._2_1_ = 'h';
        uVar24._3_1_ = 'o';
        goto LAB_00395af8;
      case 10:
        if (p_00->pNtk == (Psr_Ntk_t *)0x0) {
          if (*pcVar2 != '\0') goto LAB_00396619;
          builtin_strncpy(p_00->ErrorStr + 0xf,"without .model.",0x10);
          uVar21._0_1_ = 'D';
          uVar21._1_1_ = 'i';
          uVar21._2_1_ = 'r';
          uVar21._3_1_ = 'e';
          uVar22._0_1_ = 'c';
          uVar22._1_1_ = 't';
          uVar22._2_1_ = 'i';
          uVar22._3_1_ = 'v';
          uVar23._0_1_ = 'e';
          uVar23._1_1_ = ' ';
          uVar23._2_1_ = '.';
          uVar23._3_1_ = 'e';
          uVar24._0_1_ = 'n';
          uVar24._1_1_ = 'd';
          uVar24._2_1_ = ' ';
          uVar24._3_1_ = 'w';
        }
        else {
          p_00->pNtk = (Psr_Ntk_t *)0x0;
          pbVar14 = (byte *)p_00->pCur;
LAB_00395f21:
          bVar6 = *pbVar14;
          if (bVar6 < 0x20) {
            if ((bVar6 != 9) && (bVar6 != 0xd)) goto LAB_003961ff;
LAB_00395f5d:
            pbVar14 = pbVar14 + 1;
LAB_00395f60:
            p_00->pCur = (char *)pbVar14;
            goto LAB_00395f21;
          }
          if (bVar6 == 0x20) goto LAB_00395f5d;
          if (bVar6 == 0x5c) {
            pbVar18 = pbVar14 + 1;
            do {
              p_00->pCur = (char *)pbVar18;
              pbVar14 = pbVar18 + 1;
              bVar6 = *pbVar18;
              pbVar18 = pbVar14;
            } while (bVar6 != 10);
            goto LAB_00395f60;
          }
          if (bVar6 == 0x23) {
            do {
              pbVar14 = pbVar14 + 1;
              p_00->pCur = (char *)pbVar14;
            } while (*pbVar14 != 10);
          }
LAB_003961ff:
          bVar6 = *p_00->pCur;
          if (bVar6 < 0xd) {
            if (bVar6 == 10) {
LAB_00395ddf:
              iVar7 = 0;
              break;
            }
            if (bVar6 == 9) goto LAB_0039663d;
          }
          else if ((bVar6 == 0x20) || (bVar6 == 0xd)) goto LAB_0039663d;
          if (*pcVar2 != '\0') goto LAB_00396619;
          builtin_strncpy(p_00->ErrorStr + 0xf,"s on .end line.",0x10);
          uVar21._0_1_ = 'T';
          uVar21._1_1_ = 'r';
          uVar21._2_1_ = 'a';
          uVar21._3_1_ = 'i';
          uVar22._0_1_ = 'l';
          uVar22._1_1_ = 'i';
          uVar22._2_1_ = 'n';
          uVar22._3_1_ = 'g';
          uVar23._0_1_ = ' ';
          uVar23._1_1_ = 's';
          uVar23._2_1_ = 'y';
          uVar23._3_1_ = 'm';
          uVar24._0_1_ = 'b';
          uVar24._1_1_ = 'o';
          uVar24._2_1_ = 'l';
          uVar24._3_1_ = 's';
        }
LAB_00395af8:
        *(undefined4 *)pcVar2 = uVar21;
        *(undefined4 *)(p_00->ErrorStr + 4) = uVar22;
        *(undefined4 *)(p_00->ErrorStr + 8) = uVar23;
        *(undefined4 *)(p_00->ErrorStr + 0xc) = uVar24;
LAB_00395afd:
        iVar7 = 1;
        break;
      default:
        Abc_NamStr(p_00->pStrs,iVar7);
        printf("Cannot read directive \"%s\".\n");
        goto LAB_00395afd;
      }
      if (iVar7 != 0) break;
LAB_0039647b:
      pcVar10 = p_00->pCur;
    } while (pcVar10[1] != '\0');
  }
  cVar3 = p_00->ErrorStr[0];
  if (cVar3 != '\0') {
    pcVar10 = p_00->pBuffer;
    uVar15 = 0;
    if (pcVar10 < p_00->pCur) {
      uVar15 = 0;
      do {
        uVar15 = (ulong)((int)uVar15 + (uint)(*pcVar10 == '\n'));
        pcVar10 = pcVar10 + 1;
      } while (pcVar10 != p_00->pCur);
    }
    pVVar12 = (Vec_Ptr_t *)0x0;
    printf("Line %d: %s\n",uVar15,p_00->ErrorStr);
    if (cVar3 != '\0') goto LAB_003964e6;
  }
  pVVar12 = p_00->vNtks;
  p_00->vNtks = (Vec_Ptr_t *)0x0;
LAB_003964e6:
  if (p_00->pStrs != (Abc_Nam_t *)0x0) {
    Abc_NamDeref(p_00->pStrs);
  }
  if (p_00->vNtks != (Vec_Ptr_t *)0x0) {
    Psr_ManVecFree(p_00->vNtks);
  }
  pcVar10 = (p_00->vCover).pArray;
  if (pcVar10 != (char *)0x0) {
    free(pcVar10);
    (p_00->vCover).pArray = (char *)0x0;
  }
  (p_00->vCover).nCap = 0;
  (p_00->vCover).nSize = 0;
  piVar5 = (p_00->vTemp).pArray;
  if (piVar5 != (int *)0x0) {
    free(piVar5);
    (p_00->vTemp).pArray = (int *)0x0;
  }
  (p_00->vTemp).nCap = 0;
  (p_00->vTemp).nSize = 0;
  piVar5 = (p_00->vTemp2).pArray;
  if (piVar5 != (int *)0x0) {
    free(piVar5);
    (p_00->vTemp2).pArray = (int *)0x0;
  }
  (p_00->vTemp2).nCap = 0;
  (p_00->vTemp2).nSize = 0;
  piVar5 = (p_00->vKnown).pArray;
  if (piVar5 != (int *)0x0) {
    free(piVar5);
    (p_00->vKnown).pArray = (int *)0x0;
  }
  (p_00->vKnown).nCap = 0;
  (p_00->vKnown).nSize = 0;
  piVar5 = (p_00->vFailed).pArray;
  if (piVar5 != (int *)0x0) {
    free(piVar5);
    (p_00->vFailed).pArray = (int *)0x0;
  }
  (p_00->vFailed).nCap = 0;
  (p_00->vFailed).nSize = 0;
  piVar5 = (p_00->vSucceeded).pArray;
  if (piVar5 != (int *)0x0) {
    free(piVar5);
    (p_00->vSucceeded).pArray = (int *)0x0;
  }
  (p_00->vSucceeded).nCap = 0;
  (p_00->vSucceeded).nSize = 0;
  if (p_00->pBuffer != (char *)0x0) {
    free(p_00->pBuffer);
    p_00->pBuffer = (char *)0x0;
  }
  free(p_00);
  return pVVar12;
}

Assistant:

Vec_Ptr_t * Psr_ManReadBlif( char * pFileName )
{
    Vec_Ptr_t * vPrs = NULL;
    Psr_Man_t * p = Psr_ManAlloc( pFileName );
    if ( p == NULL )
        return NULL;
    Psr_NtkAddBlifDirectives( p );
    Psr_ManReadLines( p );
    if ( Psr_ManErrorPrint(p) )
        ABC_SWAP( Vec_Ptr_t *, vPrs, p->vNtks );
    Psr_ManFree( p );
    return vPrs;
}